

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void QApplicationPrivate::setFocusWidget(QWidget *focus,FocusReason reason)

{
  QWidget *pQVar1;
  bool bVar2;
  QWidget *pQVar3;
  QGraphicsProxyWidget *pQVar4;
  QObject *pQVar5;
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  pQVar3 = focus_widget;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (focus == (QWidget *)0x0) {
    hidden_focus_widget = (QWidget *)0x0;
    pQVar1 = hidden_focus_widget;
    if (focus_widget == (QWidget *)0x0) goto LAB_002bcbf1;
    focus_widget = (QWidget *)0x0;
  }
  else {
    pQVar3 = QWidget::window(focus);
    pQVar4 = QWidget::graphicsProxyWidget(pQVar3);
    pQVar1 = hidden_focus_widget;
    if (((pQVar4 != (QGraphicsProxyWidget *)0x0) ||
        (hidden_focus_widget = (QWidget *)0x0, pQVar1 = hidden_focus_widget, focus_widget == focus))
       || (pQVar1 = focus, (focus->data->widget_attributes & 0x10000) != 0)) goto LAB_002bcbf1;
    if (reason - TabFocusReason < 2) {
      if (qt_in_tab_key_event != false) {
LAB_002bca6c:
        pQVar3 = QWidget::window(focus);
        QWidget::setAttribute(pQVar3,WA_KeyboardFocusChange,true);
      }
    }
    else if (reason == ShortcutFocusReason) goto LAB_002bca6c;
    pQVar3 = focus_widget;
    focus_widget = focus;
    QWidgetPrivate::setFocus_sys(*(QWidgetPrivate **)&focus->field_0x8);
  }
  pQVar1 = hidden_focus_widget;
  if (reason != NoFocusReason) {
    if (pQVar3 != (QWidget *)0x0) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QFocusEvent::QFocusEvent((QFocusEvent *)&local_58,FocusOut,reason);
      local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      QPointer<QWidget>::QPointer<void>((QPointer<QWidget> *)&local_68,pQVar3);
      QCoreApplication::sendEvent(&pQVar3->super_QObject,(QEvent *)&local_58);
      bVar2 = QPointer::operator_cast_to_bool((QPointer *)&local_68);
      if (bVar2) {
        pQVar5 = &QWidget::style((QWidget *)local_68.value)->super_QObject;
        QCoreApplication::sendEvent(pQVar5,(QEvent *)&local_58);
      }
      QWeakPointer<QObject>::~QWeakPointer(&local_68);
      QFocusEvent::~QFocusEvent((QFocusEvent *)&local_58);
    }
    if (focus_widget == focus && focus != (QWidget *)0x0) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QFocusEvent::QFocusEvent((QFocusEvent *)&local_58,FocusIn,reason);
      local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      QPointer<QWidget>::QPointer<void>((QPointer<QWidget> *)&local_68,focus);
      QCoreApplication::sendEvent(&focus->super_QObject,(QEvent *)&local_58);
      bVar2 = QPointer::operator_cast_to_bool((QPointer *)&local_68);
      if (bVar2) {
        pQVar5 = &QWidget::style((QWidget *)local_68.value)->super_QObject;
        QCoreApplication::sendEvent(pQVar5,(QEvent *)&local_58);
      }
      QWeakPointer<QObject>::~QWeakPointer(&local_68);
      QFocusEvent::~QFocusEvent((QFocusEvent *)&local_58);
    }
    QApplication::focusChanged(QCoreApplication::self,pQVar3,focus_widget);
    pQVar1 = hidden_focus_widget;
  }
LAB_002bcbf1:
  hidden_focus_widget = pQVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::setFocusWidget(QWidget *focus, Qt::FocusReason reason)
{
#if QT_CONFIG(graphicsview)
    if (focus && focus->window()->graphicsProxyWidget())
        return;
#endif

    hidden_focus_widget = nullptr;

    if (focus != focus_widget) {
        if (focus && focus->isHidden()) {
            hidden_focus_widget = focus;
            return;
        }

        if (focus && (reason == Qt::BacktabFocusReason || reason == Qt::TabFocusReason)
            && qt_in_tab_key_event)
            focus->window()->setAttribute(Qt::WA_KeyboardFocusChange);
        else if (focus && reason == Qt::ShortcutFocusReason) {
            focus->window()->setAttribute(Qt::WA_KeyboardFocusChange);
        }
        QWidget *prev = focus_widget;
        focus_widget = focus;

        if (focus_widget)
            focus_widget->d_func()->setFocus_sys();

        if (reason != Qt::NoFocusReason) {

            //send events
            if (prev) {
#ifdef QT_KEYPAD_NAVIGATION
                if (QApplicationPrivate::keyboardNavigationEnabled()) {
                    if (prev->hasEditFocus() && reason != Qt::PopupFocusReason)
                        prev->setEditFocus(false);
                }
#endif
                QFocusEvent out(QEvent::FocusOut, reason);
                QPointer<QWidget> that = prev;
                QCoreApplication::sendEvent(prev, &out);
                if (that)
                    QCoreApplication::sendEvent(that->style(), &out);
            }
            if (focus && QApplicationPrivate::focus_widget == focus) {
                QFocusEvent in(QEvent::FocusIn, reason);
                QPointer<QWidget> that = focus;
                QCoreApplication::sendEvent(focus, &in);
                if (that)
                    QCoreApplication::sendEvent(that->style(), &in);
            }
            emit qApp->focusChanged(prev, focus_widget);
        }
    }
}